

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O2

bool __thiscall
ctemplate::TemplateCache::ExpandLocked
          (TemplateCache *this,TemplateString *filename,Strip strip,ExpandEmitter *expand_emitter,
          TemplateDictionaryInterface *dict,PerExpandData *per_expand_data)

{
  bool bVar1;
  RefcountedTemplate *this_00;
  Mutex *this_01;
  TemplateCacheKey template_cache_key;
  TemplateCacheKey local_40;
  
  local_40.first = TemplateString::GetGlobalId(filename);
  this_01 = this->mutex_;
  local_40.second = strip;
  Mutex::Lock(this_01);
  this_00 = GetTemplateLocked(this,filename,strip,&local_40);
  if (this_00 == (RefcountedTemplate *)0x0) {
    bVar1 = false;
  }
  else {
    RefcountedTemplate::IncRef(this_00);
    Mutex::Unlock(this_01);
    bVar1 = Template::ExpandLocked(this_00->ptr_,expand_emitter,dict,per_expand_data,this);
    this_01 = this->mutex_;
    Mutex::Lock(this_01);
    RefcountedTemplate::DecRef(this_00);
  }
  Mutex::Unlock(this_01);
  return bVar1;
}

Assistant:

bool TemplateCache::ExpandLocked(const TemplateString& filename,
                                 Strip strip,
                                 ExpandEmitter *expand_emitter,
                                 const TemplateDictionaryInterface *dict,
                                 PerExpandData *per_expand_data) {
  TemplateCacheKey template_cache_key(filename.GetGlobalId(), strip);
  RefcountedTemplate* refcounted_tpl = NULL;
  {
    WriterMutexLock ml(mutex_);
    refcounted_tpl = GetTemplateLocked(filename, strip, template_cache_key);
    if (!refcounted_tpl)
      return false;
    refcounted_tpl->IncRef();
  }
  const bool result = refcounted_tpl->tpl()->ExpandLocked(
      expand_emitter, dict, per_expand_data, this);
  {
    WriterMutexLock ml(mutex_);
    refcounted_tpl->DecRef();
  }
  return result;
}